

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blockstorage.cpp
# Opt level: O0

FlatFilePos __thiscall
node::BlockManager::FindNextBlockPos(BlockManager *this,uint nAddSize,uint nHeight,uint64_t nTime)

{
  uint uVar1;
  ConstevalStringLiteral str;
  string_view source_file;
  string_view source_file_00;
  string_view source_file_01;
  string_view logging_function;
  string_view logging_function_00;
  string_view logging_function_01;
  undefined4 uVar2;
  bool bVar3;
  BlockfileCursor *pBVar4;
  size_type sVar5;
  reference pvVar6;
  size_t sVar7;
  FlatFilePos FVar8;
  uint in_ESI;
  long in_RDI;
  long in_FS_OFFSET;
  size_t bytes_allocated;
  uint max_blockfile_size;
  bool out_of_space;
  FlatFilePos pos;
  bool finalize_undo;
  int nFile;
  int last_blockfile;
  BlockfileCursor new_cursor;
  BlockfileType chain_type;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock16;
  undefined4 in_stack_fffffffffffffdc8;
  undefined4 in_stack_fffffffffffffdcc;
  char *in_stack_fffffffffffffdd0;
  CBlockFileInfo *in_stack_fffffffffffffdd8;
  BlockManager *in_stack_fffffffffffffde0;
  BlockManager *in_stack_fffffffffffffde8;
  char *in_stack_fffffffffffffdf0;
  undefined4 in_stack_fffffffffffffdf8;
  int in_stack_fffffffffffffdfc;
  AnnotatedMixin<std::recursive_mutex> *in_stack_fffffffffffffe00;
  undefined7 in_stack_fffffffffffffe08;
  undefined1 in_stack_fffffffffffffe0f;
  undefined8 in_stack_fffffffffffffe10;
  undefined7 in_stack_fffffffffffffe18;
  undefined1 in_stack_fffffffffffffe1f;
  CBlockFileInfo *in_stack_fffffffffffffe20;
  long *plVar9;
  undefined4 in_stack_fffffffffffffe28;
  LogFlags in_stack_fffffffffffffe30;
  undefined4 in_stack_fffffffffffffe38;
  undefined1 in_stack_fffffffffffffe3c;
  undefined1 in_stack_fffffffffffffe3d;
  undefined1 in_stack_fffffffffffffe3e;
  undefined1 in_stack_fffffffffffffe3f;
  int in_stack_fffffffffffffe40;
  uint in_stack_fffffffffffffe44;
  ConstevalFormatString<3U> in_stack_fffffffffffffe78;
  size_t in_stack_fffffffffffffe80;
  char *in_stack_fffffffffffffe88;
  BlockfileCursor *in_stack_fffffffffffffe90;
  char *pcVar10;
  undefined4 in_stack_fffffffffffffe98;
  undefined4 in_stack_fffffffffffffe9c;
  uint uVar11;
  byte local_129;
  undefined1 local_c8 [40];
  undefined1 local_a0 [16];
  uint uStack_8c;
  undefined8 in_stack_ffffffffffffff70;
  undefined1 in_stack_ffffffffffffff80;
  undefined7 in_stack_ffffffffffffff81;
  pointer in_stack_ffffffffffffff88;
  pointer in_stack_ffffffffffffff90;
  pointer in_stack_ffffffffffffff98;
  undefined8 local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  MaybeCheckNotHeld<AnnotatedMixin<std::recursive_mutex>>
            ((AnnotatedMixin<std::recursive_mutex> *)
             CONCAT44(in_stack_fffffffffffffdcc,in_stack_fffffffffffffdc8));
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::UniqueLock
            ((UniqueLock<AnnotatedMixin<std::recursive_mutex>_> *)
             CONCAT17(in_stack_fffffffffffffe0f,in_stack_fffffffffffffe08),in_stack_fffffffffffffe00
             ,(char *)CONCAT44(in_stack_fffffffffffffdfc,in_stack_fffffffffffffdf8),
             in_stack_fffffffffffffdf0,(int)((ulong)in_stack_fffffffffffffde8 >> 0x20),
             SUB81((ulong)in_stack_fffffffffffffde8 >> 0x18,0));
  local_a0._8_4_ =
       BlockfileTypeForHeight
                 (in_stack_fffffffffffffde0,(int)((ulong)in_stack_fffffffffffffdd8 >> 0x20));
  std::array<std::optional<node::BlockfileCursor>,_2UL>::operator[]
            ((array<std::optional<node::BlockfileCursor>,_2UL> *)in_stack_fffffffffffffdd8,
             (size_type)in_stack_fffffffffffffdd0);
  bVar3 = std::optional::operator_cast_to_bool
                    ((optional<node::BlockfileCursor> *)
                     CONCAT44(in_stack_fffffffffffffdcc,in_stack_fffffffffffffdc8));
  if (!bVar3) {
    if (local_a0._8_4_ != ASSUMED) {
      __assert_fail("chain_type == BlockfileType::ASSUMED",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/node/blockstorage.cpp"
                    ,0x348,
                    "FlatFilePos node::BlockManager::FindNextBlockPos(unsigned int, unsigned int, uint64_t)"
                   );
    }
    local_a0._0_4_ = MaxBlockfileNum(in_stack_fffffffffffffde8);
    local_a0._0_4_ = local_a0._0_4_ + 1;
    local_a0._4_4_ = 0;
    std::array<std::optional<node::BlockfileCursor>,_2UL>::operator[]
              ((array<std::optional<node::BlockfileCursor>,_2UL> *)in_stack_fffffffffffffdd8,
               (size_type)in_stack_fffffffffffffdd0);
    std::optional<node::BlockfileCursor>::operator=
              ((optional<node::BlockfileCursor> *)in_stack_fffffffffffffdd8,
               (BlockfileCursor *)in_stack_fffffffffffffdd0);
    bVar3 = ::LogAcceptCategory(CONCAT44(in_stack_fffffffffffffdcc,in_stack_fffffffffffffdc8),Trace)
    ;
    if (bVar3) {
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_fffffffffffffde8,
                 (char *)in_stack_fffffffffffffde0);
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_fffffffffffffde8,
                 (char *)in_stack_fffffffffffffde0);
      in_stack_fffffffffffffde0 = (BlockManager *)local_a0;
      in_stack_fffffffffffffdd8 = (CBlockFileInfo *)(local_a0 + 8);
      in_stack_fffffffffffffdd0 = "[%s] initializing blockfile cursor to %s\n";
      in_stack_fffffffffffffdc8 = 1;
      logging_function._M_str._0_4_ = in_stack_fffffffffffffe98;
      logging_function._M_len = (size_t)in_stack_fffffffffffffe90;
      logging_function._M_str._4_4_ = in_stack_fffffffffffffe9c;
      source_file._M_str = in_stack_fffffffffffffe88;
      source_file._M_len = in_stack_fffffffffffffe80;
      LogPrintFormatInternal<node::BlockfileType,node::BlockfileCursor>
                (logging_function,source_file,
                 CONCAT13(in_stack_fffffffffffffe3f,
                          CONCAT12(in_stack_fffffffffffffe3e,
                                   CONCAT11(in_stack_fffffffffffffe3d,in_stack_fffffffffffffe3c))),
                 in_stack_fffffffffffffe30,(undefined4)in_stack_ffffffffffffff70,
                 (ConstevalFormatString<2U>)in_stack_fffffffffffffe78.fmt,
                 (BlockfileType *)CONCAT71(in_stack_ffffffffffffff81,in_stack_ffffffffffffff80),
                 (BlockfileCursor *)in_stack_ffffffffffffff88);
    }
  }
  std::array<std::optional<node::BlockfileCursor>,_2UL>::operator[]
            ((array<std::optional<node::BlockfileCursor>,_2UL> *)in_stack_fffffffffffffdd8,
             (size_type)in_stack_fffffffffffffdd0);
  pBVar4 = std::optional<node::BlockfileCursor>::operator->
                     ((optional<node::BlockfileCursor> *)
                      CONCAT44(in_stack_fffffffffffffdcc,in_stack_fffffffffffffdc8));
  local_c8._0_4_ = pBVar4->file_num;
  local_c8._4_4_ = local_c8._0_4_;
  sVar5 = std::vector<CBlockFileInfo,_std::allocator<CBlockFileInfo>_>::size
                    ((vector<CBlockFileInfo,_std::allocator<CBlockFileInfo>_> *)
                     CONCAT44(in_stack_fffffffffffffdcc,in_stack_fffffffffffffdc8));
  if ((int)sVar5 <= (int)local_c8._0_4_) {
    std::vector<CBlockFileInfo,_std::allocator<CBlockFileInfo>_>::resize
              ((vector<CBlockFileInfo,_std::allocator<CBlockFileInfo>_> *)in_stack_fffffffffffffde8,
               (size_type)in_stack_fffffffffffffde0);
  }
  uVar11 = 0x8000000;
  if (((*(byte *)(in_RDI + 0x128) & 1) != 0) && (uVar11 = 0x10000, 0xffff < in_ESI)) {
    uVar11 = in_ESI + 1;
  }
  if (uVar11 <= in_ESI) {
    __assert_fail("nAddSize < max_blockfile_size",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/node/blockstorage.cpp"
                  ,0x35f,
                  "FlatFilePos node::BlockManager::FindNextBlockPos(unsigned int, unsigned int, uint64_t)"
                 );
  }
  while (pvVar6 = std::vector<CBlockFileInfo,_std::allocator<CBlockFileInfo>_>::operator[]
                            ((vector<CBlockFileInfo,_std::allocator<CBlockFileInfo>_> *)
                             in_stack_fffffffffffffdd8,(size_type)in_stack_fffffffffffffdd0),
        uVar11 <= pvVar6->nSize + in_ESI) {
    pvVar6 = std::vector<CBlockFileInfo,_std::allocator<CBlockFileInfo>_>::operator[]
                       ((vector<CBlockFileInfo,_std::allocator<CBlockFileInfo>_> *)
                        in_stack_fffffffffffffdd8,(size_type)in_stack_fffffffffffffdd0);
    in_stack_fffffffffffffe44 = pvVar6->nHeightLast;
    std::array<std::optional<node::BlockfileCursor>,_2UL>::operator[]
              ((array<std::optional<node::BlockfileCursor>,_2UL> *)in_stack_fffffffffffffdd8,
               (size_type)in_stack_fffffffffffffdd0);
    inline_assertion_check<true,std::optional<node::BlockfileCursor>&>
              ((optional<node::BlockfileCursor> *)
               CONCAT17(in_stack_fffffffffffffe0f,in_stack_fffffffffffffe08),
               (char *)in_stack_fffffffffffffe00,in_stack_fffffffffffffdfc,in_stack_fffffffffffffdf0
               ,(char *)in_stack_fffffffffffffde8);
    std::optional<node::BlockfileCursor>::operator->
              ((optional<node::BlockfileCursor> *)
               CONCAT44(in_stack_fffffffffffffdcc,in_stack_fffffffffffffdc8));
    in_stack_fffffffffffffe40 = MaxBlockfileNum(in_stack_fffffffffffffde8);
    local_c8._0_4_ = in_stack_fffffffffffffe40 + 1;
    std::array<std::optional<node::BlockfileCursor>,_2UL>::operator[]
              ((array<std::optional<node::BlockfileCursor>,_2UL> *)in_stack_fffffffffffffdd8,
               (size_type)in_stack_fffffffffffffdd0);
    std::optional<node::BlockfileCursor>::operator=
              ((optional<node::BlockfileCursor> *)in_stack_fffffffffffffdd8,
               (BlockfileCursor *)in_stack_fffffffffffffdd0);
    sVar5 = std::vector<CBlockFileInfo,_std::allocator<CBlockFileInfo>_>::size
                      ((vector<CBlockFileInfo,_std::allocator<CBlockFileInfo>_> *)
                       CONCAT44(in_stack_fffffffffffffdcc,in_stack_fffffffffffffdc8));
    if ((int)sVar5 <= (int)local_c8._0_4_) {
      std::vector<CBlockFileInfo,_std::allocator<CBlockFileInfo>_>::resize
                ((vector<CBlockFileInfo,_std::allocator<CBlockFileInfo>_> *)
                 in_stack_fffffffffffffde8,(size_type)in_stack_fffffffffffffde0);
    }
  }
  FlatFilePos::FlatFilePos
            ((FlatFilePos *)CONCAT44(in_stack_fffffffffffffdcc,in_stack_fffffffffffffdc8));
  uVar2 = local_c8._0_4_;
  pvVar6 = std::vector<CBlockFileInfo,_std::allocator<CBlockFileInfo>_>::operator[]
                     ((vector<CBlockFileInfo,_std::allocator<CBlockFileInfo>_> *)
                      in_stack_fffffffffffffdd8,(size_type)in_stack_fffffffffffffdd0);
  uVar1 = pvVar6->nSize;
  if (local_c8._0_4_ != local_c8._4_4_) {
    in_stack_fffffffffffffe3f =
         ::LogAcceptCategory(CONCAT44(in_stack_fffffffffffffdcc,in_stack_fffffffffffffdc8),Trace);
    if ((bool)in_stack_fffffffffffffe3f) {
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_fffffffffffffde8,
                 (char *)in_stack_fffffffffffffde0);
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_fffffffffffffde8,
                 (char *)in_stack_fffffffffffffde0);
      pcVar10 = "Leaving block file %i: %s (onto %i) (height %i)\n";
      std::vector<CBlockFileInfo,_std::allocator<CBlockFileInfo>_>::operator[]
                ((vector<CBlockFileInfo,_std::allocator<CBlockFileInfo>_> *)
                 in_stack_fffffffffffffdd8,(size_type)in_stack_fffffffffffffdd0);
      in_stack_fffffffffffffdd0 = pcVar10;
      CBlockFileInfo::ToString_abi_cxx11_(in_stack_fffffffffffffe20);
      in_stack_fffffffffffffde8 = (BlockManager *)local_c8;
      in_stack_fffffffffffffde0 = (BlockManager *)&stack0xffffffffffffffd8;
      in_stack_fffffffffffffdd8 = (CBlockFileInfo *)(local_c8 + 4);
      in_stack_fffffffffffffdc8 = 1;
      logging_function_00._M_str._0_4_ = in_stack_fffffffffffffe98;
      logging_function_00._M_len = (size_t)in_stack_fffffffffffffdd0;
      logging_function_00._M_str._4_4_ = uVar11;
      source_file_00._M_str = in_stack_fffffffffffffe88;
      source_file_00._M_len = in_stack_fffffffffffffe80;
      in_stack_fffffffffffffe90 = (BlockfileCursor *)in_stack_fffffffffffffdd0;
      LogPrintFormatInternal<int,std::__cxx11::string,int,unsigned_int>
                (logging_function_00,source_file_00,
                 CONCAT13(in_stack_fffffffffffffe3f,
                          CONCAT12(in_stack_fffffffffffffe3e,
                                   CONCAT11(in_stack_fffffffffffffe3d,in_stack_fffffffffffffe3c))),
                 in_stack_fffffffffffffe30,(undefined4)in_stack_ffffffffffffff70,
                 (ConstevalFormatString<4U>)in_stack_fffffffffffffe78.fmt,
                 (int *)CONCAT71(in_stack_ffffffffffffff81,in_stack_ffffffffffffff80),
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_ffffffffffffff88,(int *)in_stack_ffffffffffffff90,
                 &in_stack_ffffffffffffff98->nBlocks);
      std::__cxx11::string::~string
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT44(in_stack_fffffffffffffdcc,in_stack_fffffffffffffdc8));
    }
    in_stack_fffffffffffffe3e =
         FlushBlockFile((BlockManager *)
                        CONCAT17(in_stack_fffffffffffffe1f,in_stack_fffffffffffffe18),
                        (int)((ulong)in_stack_fffffffffffffe10 >> 0x20),
                        SUB81((ulong)in_stack_fffffffffffffe10 >> 0x18,0),
                        SUB81((ulong)in_stack_fffffffffffffe10 >> 0x10,0));
    if ((!(bool)in_stack_fffffffffffffe3e) &&
       (in_stack_fffffffffffffe3d =
             ::LogAcceptCategory(CONCAT44(in_stack_fffffffffffffdcc,in_stack_fffffffffffffdc8),Trace
                                ), (bool)in_stack_fffffffffffffe3d)) {
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_fffffffffffffde8,
                 (char *)in_stack_fffffffffffffde0);
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_fffffffffffffde8,
                 (char *)in_stack_fffffffffffffde0);
      in_stack_fffffffffffffdd8 = (CBlockFileInfo *)(local_c8 + 4);
      in_stack_fffffffffffffdd0 =
           "Failed to flush previous block file %05i (finalize=1, finalize_undo=%i) before opening new block file %05i\n"
      ;
      in_stack_fffffffffffffdc8 = 3;
      logging_function_01._M_str._0_4_ = in_stack_fffffffffffffe98;
      logging_function_01._M_len = (size_t)in_stack_fffffffffffffe90;
      logging_function_01._M_str._4_4_ = uVar11;
      source_file_01._M_str =
           "Failed to flush previous block file %05i (finalize=1, finalize_undo=%i) before opening new block file %05i\n"
      ;
      source_file_01._M_len = in_stack_fffffffffffffe80;
      LogPrintFormatInternal<int,bool,int>
                (logging_function_01,source_file_01,
                 CONCAT13(in_stack_fffffffffffffe3f,
                          CONCAT12(in_stack_fffffffffffffe3e,
                                   CONCAT11(in_stack_fffffffffffffe3d,in_stack_fffffffffffffe3c))),
                 in_stack_fffffffffffffe30,(undefined4)in_stack_ffffffffffffff70,
                 in_stack_fffffffffffffe78,
                 (int *)CONCAT71(in_stack_ffffffffffffff81,in_stack_ffffffffffffff80),
                 (bool *)in_stack_ffffffffffffff88,(int *)in_stack_ffffffffffffff90);
    }
    std::array<std::optional<node::BlockfileCursor>,_2UL>::operator[]
              ((array<std::optional<node::BlockfileCursor>,_2UL> *)in_stack_fffffffffffffdd8,
               (size_type)in_stack_fffffffffffffdd0);
    std::optional<node::BlockfileCursor>::operator=
              ((optional<node::BlockfileCursor> *)in_stack_fffffffffffffdd8,
               (BlockfileCursor *)in_stack_fffffffffffffdd0);
  }
  std::vector<CBlockFileInfo,_std::allocator<CBlockFileInfo>_>::operator[]
            ((vector<CBlockFileInfo,_std::allocator<CBlockFileInfo>_> *)in_stack_fffffffffffffdd8,
             (size_type)in_stack_fffffffffffffdd0);
  CBlockFileInfo::AddBlock
            (in_stack_fffffffffffffdd8,(uint)((ulong)in_stack_fffffffffffffdd0 >> 0x20),
             CONCAT44(in_stack_fffffffffffffdcc,in_stack_fffffffffffffdc8));
  pvVar6 = std::vector<CBlockFileInfo,_std::allocator<CBlockFileInfo>_>::operator[]
                     ((vector<CBlockFileInfo,_std::allocator<CBlockFileInfo>_> *)
                      in_stack_fffffffffffffdd8,(size_type)in_stack_fffffffffffffdd0);
  pvVar6->nSize = pvVar6->nSize + in_ESI;
  sVar7 = FlatFileSeq::Allocate
                    ((FlatFileSeq *)CONCAT44(in_stack_fffffffffffffe44,in_stack_fffffffffffffe40),
                     (FlatFilePos *)
                     CONCAT17(in_stack_fffffffffffffe3f,
                              CONCAT16(in_stack_fffffffffffffe3e,
                                       CONCAT15(in_stack_fffffffffffffe3d,
                                                CONCAT14(in_stack_fffffffffffffe3c,
                                                         in_stack_fffffffffffffe38)))),
                     in_stack_fffffffffffffe30,(bool *)CONCAT44(in_ESI,in_stack_fffffffffffffe28));
  if ((local_129 & 1) == 0) {
    if ((sVar7 != 0) &&
       (bVar3 = IsPruneMode((BlockManager *)
                            CONCAT44(in_stack_fffffffffffffdcc,in_stack_fffffffffffffdc8)), bVar3))
    {
      *(undefined1 *)(in_RDI + 0x58) = 1;
    }
    std::set<int,_std::less<int>,_std::allocator<int>_>::insert
              ((set<int,_std::less<int>,_std::allocator<int>_> *)in_stack_fffffffffffffdd8,
               (value_type_conflict4 *)in_stack_fffffffffffffdd0);
    uStack_8c = uVar1;
    in_stack_ffffffffffffff70._0_4_ = uVar2;
  }
  else {
    plVar9 = *(long **)(in_RDI + 0x158);
    str.lit._7_1_ = in_stack_fffffffffffffe1f;
    str.lit._0_7_ = in_stack_fffffffffffffe18;
    ::_(str);
    (**(code **)(*plVar9 + 0x40))();
    bilingual_str::~bilingual_str
              ((bilingual_str *)CONCAT44(in_stack_fffffffffffffdcc,in_stack_fffffffffffffdc8));
    memset(&stack0xffffffffffffff70,0,8);
    FlatFilePos::FlatFilePos
              ((FlatFilePos *)CONCAT44(in_stack_fffffffffffffdcc,in_stack_fffffffffffffdc8));
  }
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::~UniqueLock
            ((UniqueLock<AnnotatedMixin<std::recursive_mutex>_> *)
             CONCAT44(in_stack_fffffffffffffdcc,in_stack_fffffffffffffdc8));
  if (*(_Base_ptr *)(in_FS_OFFSET + 0x28) != (_Base_ptr)local_8) {
    __stack_chk_fail();
  }
  uStack_8c = (uint)((ulong)in_stack_ffffffffffffff70 >> 0x20);
  FVar8.nFile = (undefined4)in_stack_ffffffffffffff70;
  FVar8.nPos = uStack_8c;
  return FVar8;
}

Assistant:

FlatFilePos BlockManager::FindNextBlockPos(unsigned int nAddSize, unsigned int nHeight, uint64_t nTime)
{
    LOCK(cs_LastBlockFile);

    const BlockfileType chain_type = BlockfileTypeForHeight(nHeight);

    if (!m_blockfile_cursors[chain_type]) {
        // If a snapshot is loaded during runtime, we may not have initialized this cursor yet.
        assert(chain_type == BlockfileType::ASSUMED);
        const auto new_cursor = BlockfileCursor{this->MaxBlockfileNum() + 1};
        m_blockfile_cursors[chain_type] = new_cursor;
        LogDebug(BCLog::BLOCKSTORAGE, "[%s] initializing blockfile cursor to %s\n", chain_type, new_cursor);
    }
    const int last_blockfile = m_blockfile_cursors[chain_type]->file_num;

    int nFile = last_blockfile;
    if (static_cast<int>(m_blockfile_info.size()) <= nFile) {
        m_blockfile_info.resize(nFile + 1);
    }

    bool finalize_undo = false;
    unsigned int max_blockfile_size{MAX_BLOCKFILE_SIZE};
    // Use smaller blockfiles in test-only -fastprune mode - but avoid
    // the possibility of having a block not fit into the block file.
    if (m_opts.fast_prune) {
        max_blockfile_size = 0x10000; // 64kiB
        if (nAddSize >= max_blockfile_size) {
            // dynamically adjust the blockfile size to be larger than the added size
            max_blockfile_size = nAddSize + 1;
        }
    }
    assert(nAddSize < max_blockfile_size);

    while (m_blockfile_info[nFile].nSize + nAddSize >= max_blockfile_size) {
        // when the undo file is keeping up with the block file, we want to flush it explicitly
        // when it is lagging behind (more blocks arrive than are being connected), we let the
        // undo block write case handle it
        finalize_undo = (static_cast<int>(m_blockfile_info[nFile].nHeightLast) ==
                         Assert(m_blockfile_cursors[chain_type])->undo_height);

        // Try the next unclaimed blockfile number
        nFile = this->MaxBlockfileNum() + 1;
        // Set to increment MaxBlockfileNum() for next iteration
        m_blockfile_cursors[chain_type] = BlockfileCursor{nFile};

        if (static_cast<int>(m_blockfile_info.size()) <= nFile) {
            m_blockfile_info.resize(nFile + 1);
        }
    }
    FlatFilePos pos;
    pos.nFile = nFile;
    pos.nPos = m_blockfile_info[nFile].nSize;

    if (nFile != last_blockfile) {
        LogDebug(BCLog::BLOCKSTORAGE, "Leaving block file %i: %s (onto %i) (height %i)\n",
                 last_blockfile, m_blockfile_info[last_blockfile].ToString(), nFile, nHeight);

        // Do not propagate the return code. The flush concerns a previous block
        // and undo file that has already been written to. If a flush fails
        // here, and we crash, there is no expected additional block data
        // inconsistency arising from the flush failure here. However, the undo
        // data may be inconsistent after a crash if the flush is called during
        // a reindex. A flush error might also leave some of the data files
        // untrimmed.
        if (!FlushBlockFile(last_blockfile, /*fFinalize=*/true, finalize_undo)) {
            LogPrintLevel(BCLog::BLOCKSTORAGE, BCLog::Level::Warning,
                          "Failed to flush previous block file %05i (finalize=1, finalize_undo=%i) before opening new block file %05i\n",
                          last_blockfile, finalize_undo, nFile);
        }
        // No undo data yet in the new file, so reset our undo-height tracking.
        m_blockfile_cursors[chain_type] = BlockfileCursor{nFile};
    }

    m_blockfile_info[nFile].AddBlock(nHeight, nTime);
    m_blockfile_info[nFile].nSize += nAddSize;

    bool out_of_space;
    size_t bytes_allocated = m_block_file_seq.Allocate(pos, nAddSize, out_of_space);
    if (out_of_space) {
        m_opts.notifications.fatalError(_("Disk space is too low!"));
        return {};
    }
    if (bytes_allocated != 0 && IsPruneMode()) {
        m_check_for_pruning = true;
    }

    m_dirty_fileinfo.insert(nFile);
    return pos;
}